

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O0

string * __thiscall pbrt::FresnelConductor::ToString_abi_cxx11_(FresnelConductor *this)

{
  string *in_RDI;
  SampledSpectrum *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::SampledSpectrum_const&,pbrt::SampledSpectrum_const&>
            (in_stack_00000018,in_stack_00000010,(SampledSpectrum *)this);
  return in_RDI;
}

Assistant:

std::string FresnelConductor::ToString() const {
    return StringPrintf("[ FresnelConductor eta: %s k: %s ]", eta, k);
}